

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_m2mf.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::M2mf::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,M2mf *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  MthdM2mfPitch *pMVar1;
  MthdM2mfOffset *pMVar2;
  MthdDmaGrobj *pMVar3;
  MthdDmaNotify *pMVar4;
  MthdPmTrigger *pMVar5;
  MthdNotify *pMVar6;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar7;
  result_type rVar8;
  SingleMthdTest *pSVar9;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_2d7;
  allocator local_2d6;
  allocator local_2d5;
  allocator local_2d4;
  allocator local_2d3;
  allocator local_2d2;
  allocator local_2d1;
  allocator local_2d0;
  allocator local_2cf;
  allocator local_2ce;
  allocator local_2cd;
  allocator local_2cc;
  allocator local_2cb;
  allocator local_2ca;
  allocator local_2c9;
  SingleMthdTest *local_2c8;
  SingleMthdTest *local_2c0;
  MthdM2mfPitch *local_2b8;
  MthdM2mfPitch *local_2b0;
  MthdM2mfOffset *local_2a8;
  MthdM2mfOffset *local_2a0;
  MthdDmaGrobj *local_298;
  MthdDmaGrobj *local_290;
  MthdDmaNotify *local_288;
  MthdPmTrigger *local_280;
  MthdNotify *local_278;
  SingleMthdTest *local_270;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_268;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  SingleMthdTest *local_a0;
  MthdNotify *local_98;
  MthdPmTrigger *local_90;
  MthdDmaNotify *local_88;
  MthdDmaGrobj *local_80;
  MthdDmaGrobj *local_78;
  MthdM2mfOffset *local_70;
  MthdM2mfOffset *local_68;
  MthdM2mfPitch *local_60;
  MthdM2mfPitch *local_58;
  SingleMthdTest *local_50;
  SingleMthdTest *local_48;
  SingleMthdTest *local_40;
  SingleMthdTest *local_38;
  
  local_270 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_268 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_c0,"nop",&local_2c9);
  pSVar9 = local_270;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_270,opt,(uint32_t)rVar8,&local_c0,-1,(this->super_Class).cls,0x100,1,4
            );
  local_a0 = pSVar9;
  local_278 = (MthdNotify *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_e0,"notify",&local_2ca);
  pMVar6 = local_278;
  MthdNotify::SingleMthdTest
            (local_278,opt,(uint32_t)rVar8,&local_e0,0,(this->super_Class).cls,0x104,1,4);
  local_98 = pMVar6;
  local_280 = (MthdPmTrigger *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_100,"pm_trigger",&local_2cb);
  pMVar5 = local_280;
  MthdPmTrigger::SingleMthdTest
            (local_280,opt,(uint32_t)rVar8,&local_100,-1,(this->super_Class).cls,0x140,1,4);
  local_90 = pMVar5;
  local_288 = (MthdDmaNotify *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_120,"dma_notify",&local_2cc);
  pMVar4 = local_288;
  MthdDmaNotify::SingleMthdTest
            (local_288,opt,(uint32_t)rVar8,&local_120,1,(this->super_Class).cls,0x180,1,4);
  local_88 = pMVar4;
  local_290 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_140,"dma_in",&local_2cd);
  pMVar3 = local_290;
  MthdDmaGrobj::MthdDmaGrobj
            (local_290,opt,(uint32_t)rVar8,&local_140,2,(this->super_Class).cls,0x184,0,2);
  local_80 = pMVar3;
  local_298 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_160,"dma_out",&local_2ce);
  pMVar3 = local_298;
  MthdDmaGrobj::MthdDmaGrobj
            (local_298,opt,(uint32_t)rVar8,&local_160,3,(this->super_Class).cls,0x188,1,9);
  local_78 = pMVar3;
  local_2a0 = (MthdM2mfOffset *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_180,"offset_in",&local_2cf);
  pMVar2 = local_2a0;
  anon_unknown_3::MthdM2mfOffset::MthdM2mfOffset
            (local_2a0,opt,(uint32_t)rVar8,&local_180,4,(this->super_Class).cls,0x30c,0);
  local_70 = pMVar2;
  local_2a8 = (MthdM2mfOffset *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1a0,"offset_out",&local_2d0);
  pMVar2 = local_2a8;
  anon_unknown_3::MthdM2mfOffset::MthdM2mfOffset
            (local_2a8,opt,(uint32_t)rVar8,&local_1a0,5,(this->super_Class).cls,0x310,1);
  local_68 = pMVar2;
  local_2b0 = (MthdM2mfPitch *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1c0,"pitch_in",&local_2d1);
  pMVar1 = local_2b0;
  anon_unknown_3::MthdM2mfPitch::MthdM2mfPitch
            (local_2b0,opt,(uint32_t)rVar8,&local_1c0,6,(this->super_Class).cls,0x314,0);
  local_60 = pMVar1;
  local_2b8 = (MthdM2mfPitch *)operator_new(0x25958);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1e0,"pitch_out",&local_2d2);
  pMVar1 = local_2b8;
  anon_unknown_3::MthdM2mfPitch::MthdM2mfPitch
            (local_2b8,opt,(uint32_t)rVar8,&local_1e0,7,(this->super_Class).cls,0x318,1);
  local_58 = pMVar1;
  local_2c0 = (SingleMthdTest *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_200,"line_length",&local_2d3);
  pSVar9 = local_2c0;
  pgraph::SingleMthdTest::SingleMthdTest
            (local_2c0,opt,(uint32_t)rVar8,&local_200,8,(this->super_Class).cls,0x31c,1,4);
  (pSVar9->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00312128;
  local_50 = pSVar9;
  local_2c8 = (SingleMthdTest *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_220,"line_count",&local_2d4);
  pSVar9 = local_2c8;
  pgraph::SingleMthdTest::SingleMthdTest
            (local_2c8,opt,(uint32_t)rVar8,&local_220,9,(this->super_Class).cls,800,1,4);
  (pSVar9->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00312220;
  local_48 = pSVar9;
  pSVar9 = (SingleMthdTest *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_240,"format",&local_2d5);
  pgraph::SingleMthdTest::SingleMthdTest
            (pSVar9,opt,(uint32_t)rVar8,&local_240,10,(this->super_Class).cls,0x324,1,4);
  (pSVar9->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00312318;
  local_40 = pSVar9;
  pSVar9 = (SingleMthdTest *)operator_new(0x25950);
  rVar8 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_260,"trigger",&local_2d6);
  pgraph::SingleMthdTest::SingleMthdTest
            (pSVar9,opt,(uint32_t)rVar8,&local_260,0xb,(this->super_Class).cls,0x328,1,4);
  pvVar7 = local_268;
  (pSVar9->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00312410;
  __l._M_len = 0xe;
  __l._M_array = &local_a0;
  local_38 = pSVar9;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_268,__l,&local_2d7);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  return pvVar7;
}

Assistant:

std::vector<SingleMthdTest *> M2mf::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_in", 2, cls, 0x184, 0, DMA_R | DMA_CLR),
		new MthdDmaGrobj(opt, rnd(), "dma_out", 3, cls, 0x188, 1, DMA_W | DMA_CHECK_PREV),
		new MthdM2mfOffset(opt, rnd(), "offset_in", 4, cls, 0x30c, 0),
		new MthdM2mfOffset(opt, rnd(), "offset_out", 5, cls, 0x310, 1),
		new MthdM2mfPitch(opt, rnd(), "pitch_in", 6, cls, 0x314, 0),
		new MthdM2mfPitch(opt, rnd(), "pitch_out", 7, cls, 0x318, 1),
		new MthdM2mfLineLength(opt, rnd(), "line_length", 8, cls, 0x31c),
		new MthdM2mfLineCount(opt, rnd(), "line_count", 9, cls, 0x320),
		new MthdM2mfFormat(opt, rnd(), "format", 10, cls, 0x324),
		new MthdM2mfTrigger(opt, rnd(), "trigger", 11, cls, 0x328),
	};
}